

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O0

void __thiscall
pbrt::FormattingScene::Texture
          (FormattingScene *this,string *name,string *type,string *texname,
          ParsedParameterVector *params,FileLoc loc)

{
  double dVar1;
  bool bVar2;
  mapped_type *pmVar3;
  size_t sVar4;
  reference pvVar5;
  size_type sVar6;
  reference pvVar7;
  ostream *poVar8;
  string *in_RSI;
  char *pcVar9;
  long in_RDI;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_R8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> gamma_1;
  Float gamma;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tri;
  string extra;
  ParameterDictionary dict;
  ParsedParameter *p_1;
  iterator __end3_1;
  iterator __begin3_1;
  ParsedParameterVector *__range3_1;
  bool foundTexture;
  bool foundRGB;
  ParsedParameter *p;
  iterator __end3;
  iterator __begin3;
  ParsedParameterVector *__range3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb18;
  ParameterDictionary *in_stack_fffffffffffffb20;
  ParameterDictionary *in_stack_fffffffffffffb28;
  SceneRepresentation *in_stack_fffffffffffffb30;
  undefined7 in_stack_fffffffffffffb38;
  undefined1 in_stack_fffffffffffffb3f;
  RGBColorSpace *in_stack_fffffffffffffb40;
  int extra_00;
  FormattingScene *in_stack_fffffffffffffb48;
  ParameterDictionary *in_stack_fffffffffffffb50;
  undefined4 in_stack_fffffffffffffb58;
  Float in_stack_fffffffffffffb5c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb60;
  undefined6 in_stack_fffffffffffffb68;
  undefined1 in_stack_fffffffffffffb6e;
  undefined1 in_stack_fffffffffffffb6f;
  allocator<char> *in_stack_fffffffffffffb70;
  undefined7 in_stack_fffffffffffffb80;
  undefined1 in_stack_fffffffffffffb87;
  ParameterDictionary *this_00;
  int indentCount;
  ParameterDictionary *in_stack_fffffffffffffb98;
  string local_430 [32];
  string local_410 [32];
  string local_3f0 [32];
  string local_3d0 [32];
  string local_3b0 [32];
  string local_390 [39];
  undefined1 local_369 [40];
  undefined1 local_341 [33];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_320;
  string local_308 [32];
  string local_2e8 [32];
  string local_2c8 [39];
  undefined1 local_2a1 [40];
  undefined1 local_279 [37];
  float local_254;
  string local_250 [32];
  string local_230 [39];
  allocator<char> local_209;
  string local_208 [39];
  allocator<char> local_1e1;
  string local_1e0 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1c0;
  string local_1a8 [32];
  ParameterDictionary local_188 [2];
  ParsedParameter *local_b8;
  iterator local_b0;
  iterator local_a8;
  byte local_92;
  byte local_91;
  ParsedParameter *local_90;
  iterator local_88;
  iterator local_80;
  int local_5c;
  string local_58 [32];
  _Self local_38;
  _Self local_30 [4];
  string *local_10;
  
  if ((*(byte *)(in_RDI + 0x11) & 1) != 0) {
    local_10 = in_RSI;
    local_30[0]._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)in_stack_fffffffffffffb18,(key_type *)0x445c3a);
    local_38._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffffb18);
    bVar2 = std::operator!=(local_30,&local_38);
    if (bVar2) {
      Warning<std::__cxx11::string_const&>
                ((FileLoc *)in_stack_fffffffffffffb60,
                 (char *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb50);
      local_5c = Texture::count;
      Texture::count = Texture::count + 1;
      StringPrintf<std::__cxx11::string_const&,int>
                ((char *)in_stack_fffffffffffffb48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb40,
                 (int *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38));
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffb60,
                            (key_type *)
                            CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
      std::__cxx11::string::operator=((string *)pmVar3,local_58);
      std::__cxx11::string::~string(local_58);
    }
    else {
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffb60,
                            (key_type *)
                            CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
      std::__cxx11::string::operator=((string *)pmVar3,local_10);
    }
  }
  if (((*(byte *)(in_RDI + 0x11) & 1) != 0) &&
     (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffb20,(char *)in_stack_fffffffffffffb18), bVar2))
  {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffb20,(char *)in_stack_fffffffffffffb18);
    if (bVar2) {
      local_80 = InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                 ::begin(in_R8);
      local_88 = InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                 ::end(&in_stack_fffffffffffffb20->params);
      for (; local_80 != local_88; local_80 = local_80 + 1) {
        local_90 = *local_80;
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffb20,(char *)in_stack_fffffffffffffb18);
        if (bVar2) {
          std::__cxx11::string::operator=((string *)&local_90->name,"tex");
        }
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffb20,(char *)in_stack_fffffffffffffb18);
        if (bVar2) {
          std::__cxx11::string::operator=((string *)&local_90->name,"scale");
        }
      }
    }
    else {
      local_91 = 0;
      local_92 = 0;
      local_a8 = InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                 ::begin(in_R8);
      local_b0 = InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                 ::end(&in_stack_fffffffffffffb20->params);
      for (; local_a8 != local_b0; local_a8 = local_a8 + 1) {
        local_b8 = *local_a8;
        bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffb20,(char *)in_stack_fffffffffffffb18);
        if ((!bVar2) ||
           (bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffb20,(char *)in_stack_fffffffffffffb18),
           !bVar2)) {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffb20,(char *)in_stack_fffffffffffffb18);
          if (bVar2) {
            if ((local_91 & 1) != 0) {
              SceneRepresentation::ErrorExitDeferred<std::__cxx11::string_const&>
                        (in_stack_fffffffffffffb30,(FileLoc *)in_stack_fffffffffffffb28,
                         (char *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
              return;
            }
            sVar4 = pstd::vector<double,_pstd::pmr::polymorphic_allocator<double>_>::size
                              (&local_b8->numbers);
            if (sVar4 != 3) {
              SceneRepresentation::ErrorExitDeferred<std::__cxx11::string&>
                        (in_stack_fffffffffffffb30,(FileLoc *)in_stack_fffffffffffffb28,
                         (char *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
              return;
            }
            pvVar5 = pstd::vector<double,_pstd::pmr::polymorphic_allocator<double>_>::operator[]
                               (&local_b8->numbers,0);
            dVar1 = *pvVar5;
            pvVar5 = pstd::vector<double,_pstd::pmr::polymorphic_allocator<double>_>::operator[]
                               (&local_b8->numbers,1);
            if ((dVar1 != *pvVar5) || (NAN(dVar1) || NAN(*pvVar5))) {
LAB_00446098:
              SceneRepresentation::ErrorExitDeferred<std::__cxx11::string&>
                        (in_stack_fffffffffffffb30,(FileLoc *)in_stack_fffffffffffffb28,
                         (char *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
              return;
            }
            pvVar5 = pstd::vector<double,_pstd::pmr::polymorphic_allocator<double>_>::operator[]
                               (&local_b8->numbers,1);
            in_stack_fffffffffffffb98 = (ParameterDictionary *)*pvVar5;
            pvVar5 = pstd::vector<double,_pstd::pmr::polymorphic_allocator<double>_>::operator[]
                               (&local_b8->numbers,2);
            if (((double)in_stack_fffffffffffffb98 != *pvVar5) ||
               (NAN((double)in_stack_fffffffffffffb98) || NAN(*pvVar5))) goto LAB_00446098;
            local_91 = 1;
            std::__cxx11::string::operator=((string *)local_b8,"float");
            std::__cxx11::string::operator=((string *)&local_b8->name,"scale");
            pstd::vector<double,_pstd::pmr::polymorphic_allocator<double>_>::resize
                      ((vector<double,_pstd::pmr::polymorphic_allocator<double>_> *)
                       in_stack_fffffffffffffb50,(size_type)in_stack_fffffffffffffb48);
          }
          else {
            if ((local_92 & 1) != 0) {
              SceneRepresentation::ErrorExitDeferred<std::__cxx11::string_const&>
                        (in_stack_fffffffffffffb30,(FileLoc *)in_stack_fffffffffffffb28,
                         (char *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
              return;
            }
            std::__cxx11::string::operator=((string *)&local_b8->name,"tex");
            local_92 = 1;
          }
        }
      }
    }
  }
  this_00 = local_188;
  pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>::polymorphic_allocator
            ((polymorphic_allocator<pbrt::ParsedParameter_*> *)in_stack_fffffffffffffb20);
  indentCount = (int)((ulong)&local_188[0].params.ptr >> 0x20);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector((InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                   *)in_stack_fffffffffffffb40,
                  (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                   *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                  (polymorphic_allocator<pbrt::ParsedParameter_*> *)in_stack_fffffffffffffb30);
  ParameterDictionary::ParameterDictionary
            (in_stack_fffffffffffffb50,(ParsedParameterVector *)in_stack_fffffffffffffb48,
             in_stack_fffffffffffffb40);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&in_stack_fffffffffffffb20->params);
  if ((*(byte *)(in_RDI + 0x11) & 1) != 0) {
    ParameterDictionary::RenameUsedTextures
              (this_00,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80));
  }
  std::__cxx11::string::string(local_1a8);
  if ((*(byte *)(in_RDI + 0x11) & 1) != 0) {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffb20,(char *)in_stack_fffffffffffffb18);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffb60,
                 (char *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                 (allocator<char> *)in_stack_fffffffffffffb50);
      ParameterDictionary::GetBoolArray
                (in_stack_fffffffffffffb28,(string *)in_stack_fffffffffffffb20);
      std::__cxx11::string::~string(local_1e0);
      std::allocator<char>::~allocator(&local_1e1);
      sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_1c0);
      if (sVar6 == 1) {
        in_stack_fffffffffffffb70 = &local_209;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffb60,
                   (char *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                   (allocator<char> *)in_stack_fffffffffffffb50);
        ParameterDictionary::RemoveBool(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
        std::__cxx11::string::~string(local_208);
        std::allocator<char>::~allocator(&local_209);
        indent_abi_cxx11_(in_stack_fffffffffffffb48,(int)((ulong)in_stack_fffffffffffffb40 >> 0x20))
        ;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20);
        std::__cxx11::string::operator+=(local_1a8,local_230);
        std::__cxx11::string::~string(local_230);
        std::__cxx11::string::~string(local_250);
        pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (&local_1c0,0);
        pcVar9 = "\"bilinear\"\n";
        if (*pvVar7 != '\0') {
          pcVar9 = "\"trilinear\"\n";
        }
        std::__cxx11::string::operator+=(local_1a8,pcVar9);
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb30)
      ;
    }
    in_stack_fffffffffffffb6f =
         std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffb20,(char *)in_stack_fffffffffffffb18);
    if (((bool)in_stack_fffffffffffffb6f) ||
       (in_stack_fffffffffffffb6e =
             std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffb20,(char *)in_stack_fffffffffffffb18),
       (bool)in_stack_fffffffffffffb6e)) {
      in_stack_fffffffffffffb60 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_279;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffb60,
                 (char *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                 (allocator<char> *)in_stack_fffffffffffffb50);
      in_stack_fffffffffffffb5c =
           ParameterDictionary::GetOneFloat(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,0.0)
      ;
      std::__cxx11::string::~string((string *)(local_279 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_279);
      local_254 = in_stack_fffffffffffffb5c;
      if ((in_stack_fffffffffffffb5c != 0.0) || (NAN(in_stack_fffffffffffffb5c))) {
        in_stack_fffffffffffffb50 = (ParameterDictionary *)local_2a1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffb60,
                   (char *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                   (allocator<char> *)in_stack_fffffffffffffb50);
        ParameterDictionary::RemoveFloat(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
        std::__cxx11::string::~string((string *)(local_2a1 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_2a1);
        indent_abi_cxx11_(in_stack_fffffffffffffb48,(int)((ulong)in_stack_fffffffffffffb40 >> 0x20))
        ;
        StringPrintf<float&>((char *)in_stack_fffffffffffffb48,(float *)in_stack_fffffffffffffb40);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffb50);
        std::__cxx11::string::operator+=(local_1a8,local_2c8);
        std::__cxx11::string::~string(local_2c8);
        std::__cxx11::string::~string(local_308);
        std::__cxx11::string::~string(local_2e8);
      }
      else {
        in_stack_fffffffffffffb48 = (FormattingScene *)local_341;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffb60,
                   (char *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                   (allocator<char> *)in_stack_fffffffffffffb50);
        ParameterDictionary::GetBoolArray
                  (in_stack_fffffffffffffb28,(string *)in_stack_fffffffffffffb20);
        std::__cxx11::string::~string((string *)(local_341 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_341);
        sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_320);
        if (sVar6 == 1) {
          in_stack_fffffffffffffb40 = (RGBColorSpace *)local_369;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffb60,
                     (char *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                     (allocator<char> *)in_stack_fffffffffffffb50);
          ParameterDictionary::RemoveBool(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
          std::__cxx11::string::~string((string *)(local_369 + 1));
          std::allocator<char>::~allocator((allocator<char> *)local_369);
          indent_abi_cxx11_(in_stack_fffffffffffffb48,
                            (int)((ulong)in_stack_fffffffffffffb40 >> 0x20));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20);
          std::__cxx11::string::operator+=(local_1a8,local_390);
          std::__cxx11::string::~string(local_390);
          std::__cxx11::string::~string(local_3b0);
          pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (&local_320,0);
          pcVar9 = "\"linear\"\n";
          if (*pvVar7 != '\0') {
            pcVar9 = "\"sRGB\"\n";
          }
          std::__cxx11::string::operator+=(local_1a8,pcVar9);
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffb30);
      }
    }
  }
  extra_00 = (int)((ulong)in_stack_fffffffffffffb40 >> 0x20);
  if ((*(byte *)(in_RDI + 0x11) & 1) == 0) {
    indent_abi_cxx11_(in_stack_fffffffffffffb48,extra_00);
    Printf<std::__cxx11::string,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&>
              ((char *)in_stack_fffffffffffffb70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffb6f,
                        CONCAT16(in_stack_fffffffffffffb6e,in_stack_fffffffffffffb68)),
               in_stack_fffffffffffffb60,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb50);
    std::__cxx11::string::~string(local_410);
  }
  else {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffb20,(char *)in_stack_fffffffffffffb18);
    if (bVar2) {
      indent_abi_cxx11_(in_stack_fffffffffffffb48,extra_00);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)in_stack_fffffffffffffb60,
                   (key_type *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
      Printf<std::__cxx11::string,std::__cxx11::string&,std::__cxx11::string_const&>
                ((char *)in_stack_fffffffffffffb60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb48);
      std::__cxx11::string::~string(local_3d0);
    }
    else {
      indent_abi_cxx11_(in_stack_fffffffffffffb48,extra_00);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)in_stack_fffffffffffffb60,
                   (key_type *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
      Printf<std::__cxx11::string,std::__cxx11::string&,std::__cxx11::string_const&,std::__cxx11::string_const&>
                ((char *)in_stack_fffffffffffffb70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffb6f,
                          CONCAT16(in_stack_fffffffffffffb6e,in_stack_fffffffffffffb68)),
                 in_stack_fffffffffffffb60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb50);
      std::__cxx11::string::~string(local_3f0);
    }
  }
  poVar8 = std::operator<<((ostream *)&std::cout,local_1a8);
  ParameterDictionary::ToParameterList_abi_cxx11_(in_stack_fffffffffffffb98,indentCount);
  std::operator<<(poVar8,local_430);
  std::__cxx11::string::~string(local_430);
  std::__cxx11::string::~string(local_1a8);
  ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x446cfe);
  return;
}

Assistant:

void FormattingScene::Texture(const std::string &name, const std::string &type,
                              const std::string &texname, ParsedParameterVector params,
                              FileLoc loc) {
    if (upgrade) {
        if (definedTextures.find(name) != definedTextures.end()) {
            static int count = 0;
            Warning(&loc, "%s: renaming multiply-defined texture", name);
            definedTextures[name] = StringPrintf("%s-renamed-%d", name, count++);
        } else
            definedTextures[name] = name;
    }

    if (upgrade && texname == "scale") {
        // This is easier to do in the raw ParsedParameterVector...
        if (type == "float") {
            for (ParsedParameter *p : params) {
                if (p->name == "tex1")
                    p->name = "tex";
                if (p->name == "tex2")
                    p->name = "scale";
            }
        } else {
            // more subtle: rename one of them as float, but need one of them
            // to be an RGB and spectrally constant...
            bool foundRGB = false, foundTexture = false;
            for (ParsedParameter *p : params) {
                if (p->name != "tex1" && p->name != "tex2")
                    continue;

                if (p->type == "rgb") {
                    if (foundRGB) {
                        ErrorExitDeferred(
                            &p->loc,
                            "Two \"rgb\" textures found for \"scale\" "
                            "texture \"%s\". Please manually edit the file to "
                            "upgrade.",
                            name);
                        return;
                    }
                    if (p->numbers.size() != 3) {
                        ErrorExitDeferred(
                            &p->loc, "Didn't find 3 values for \"rgb\" \"%s\".", p->name);
                        return;
                    }
                    if (p->numbers[0] != p->numbers[1] ||
                        p->numbers[1] != p->numbers[2]) {
                        ErrorExitDeferred(&p->loc,
                                          "Non-constant \"rgb\" value found for "
                                          "\"scale\" texture parameter \"%s\". Please "
                                          "manually "
                                          "edit the file to upgrade.",
                                          p->name);
                        return;
                    }

                    foundRGB = true;
                    p->type = "float";
                    p->name = "scale";
                    p->numbers.resize(1);
                } else {
                    if (foundTexture) {
                        ErrorExitDeferred(
                            &p->loc,
                            "Two textures found for \"scale\" "
                            "texture \"%s\". Please manually edit the file to "
                            "upgrade.",
                            name);
                        return;
                    }
                    p->name = "tex";
                    foundTexture = true;
                }
            }
        }
    }

    ParameterDictionary dict(params, RGBColorSpace::sRGB);
    if (upgrade)
        dict.RenameUsedTextures(definedTextures);

    std::string extra;
    if (upgrade) {
        if (texname == "imagemap") {
            std::vector<uint8_t> tri = dict.GetBoolArray("trilinear");
            if (tri.size() == 1) {
                dict.RemoveBool("trilinear");
                extra += indent(1) + "\"string filter\" ";
                extra += tri[0] != 0u ? "\"trilinear\"\n" : "\"bilinear\"\n";
            }
        }

        if (texname == "imagemap" || texname == "ptex") {
            Float gamma = dict.GetOneFloat("gamma", 0);
            if (gamma != 0) {
                dict.RemoveFloat("gamma");
                extra +=
                    indent(1) + StringPrintf("\"string encoding \" \"gamma %f\" ", gamma);
            } else {
                std::vector<uint8_t> gamma = dict.GetBoolArray("gamma");
                if (gamma.size() == 1) {
                    dict.RemoveBool("gamma");
                    extra += indent(1) + "\"string encoding\" ";
                    extra += gamma[0] != 0u ? "\"sRGB\"\n" : "\"linear\"\n";
                }
            }
        }
    }

    if (upgrade) {
        if (type == "color")
            Printf("%sTexture \"%s\" \"spectrum\" \"%s\"\n", indent(),
                   definedTextures[name], texname);
        else
            Printf("%sTexture \"%s\" \"%s\" \"%s\"\n", indent(), definedTextures[name],
                   type, texname);
    } else
        Printf("%sTexture \"%s\" \"%s\" \"%s\"\n", indent(), name, type, texname);

    std::cout << extra << dict.ToParameterList(catIndentCount);
}